

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O3

int run_test_tty(void)

{
  uint uVar1;
  int iVar2;
  uv_handle_type uVar3;
  int iVar4;
  uint extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  int *piVar7;
  int height;
  int width;
  uv_tty_t tty_in;
  uv_tty_t tty_out;
  uint uStack_f80;
  uint uStack_f7c;
  undefined1 auStack_f78 [8];
  undefined1 auStack_f70 [312];
  undefined1 auStack_e38 [1160];
  uv_loop_t *puStack_9b0;
  code *pcStack_9a8;
  undefined1 auStack_998 [312];
  undefined1 auStack_860 [312];
  undefined1 auStack_728 [1160];
  uv_loop_t *puStack_2a0;
  uint local_290;
  uint local_28c;
  uv_tty_t local_288;
  uv_tty_t local_150;
  
  puStack_2a0 = (uv_loop_t *)0x1755a8;
  puVar5 = uv_default_loop();
  puStack_2a0 = (uv_loop_t *)0x1755bd;
  uVar1 = open64("/dev/tty",0,0);
  if (-1 < (int)uVar1) {
    piVar7 = (int *)(ulong)uVar1;
    puStack_2a0 = (uv_loop_t *)0x1755dd;
    iVar2 = open64("/dev/tty",1,0);
    if (-1 < iVar2) {
      puStack_2a0 = (uv_loop_t *)0x1755f1;
      uVar3 = uv_guess_handle(-1);
      if (uVar3 == UV_UNKNOWN_HANDLE) {
        puStack_2a0 = (uv_loop_t *)0x175601;
        uVar3 = uv_guess_handle(uVar1);
        if (uVar3 != UV_TTY) goto LAB_0017583d;
        puStack_2a0 = (uv_loop_t *)0x175611;
        uVar3 = uv_guess_handle(iVar2);
        if (uVar3 != UV_TTY) goto LAB_00175842;
        puStack_2a0 = (uv_loop_t *)0x17561f;
        puVar6 = uv_default_loop();
        puStack_2a0 = (uv_loop_t *)0x175634;
        iVar4 = uv_tty_init(puVar6,&local_288,uVar1,1);
        if (iVar4 != 0) goto LAB_00175847;
        puStack_2a0 = (uv_loop_t *)0x175646;
        iVar4 = uv_is_readable((uv_stream_t *)&local_288);
        if (iVar4 == 0) goto LAB_0017584c;
        puStack_2a0 = (uv_loop_t *)0x175658;
        iVar4 = uv_is_writable((uv_stream_t *)&local_288);
        if (iVar4 != 0) goto LAB_00175851;
        puStack_2a0 = (uv_loop_t *)0x175665;
        puVar6 = uv_default_loop();
        puStack_2a0 = (uv_loop_t *)0x175679;
        iVar2 = uv_tty_init(puVar6,&local_150,iVar2,0);
        if (iVar2 != 0) goto LAB_00175856;
        puStack_2a0 = (uv_loop_t *)0x17568e;
        iVar2 = uv_is_readable((uv_stream_t *)&local_150);
        if (iVar2 != 0) goto LAB_0017585b;
        puStack_2a0 = (uv_loop_t *)0x1756a3;
        iVar2 = uv_is_writable((uv_stream_t *)&local_150);
        if (iVar2 == 0) goto LAB_00175860;
        puStack_2a0 = (uv_loop_t *)0x1756c2;
        iVar2 = uv_tty_get_winsize(&local_150,(int *)&local_28c,(int *)&local_290);
        if (iVar2 != 0) goto LAB_00175865;
        puStack_2a0 = (uv_loop_t *)0x1756e0;
        printf("width=%d height=%d\n",(ulong)local_28c,(ulong)local_290);
        if (local_28c == 0 && local_290 == 0) {
          puStack_2a0 = (uv_loop_t *)0x1756f3;
          puVar5 = uv_default_loop();
          puStack_2a0 = (uv_loop_t *)0x175707;
          uv_walk(puVar5,close_walk_cb,(void *)0x0);
          puStack_2a0 = (uv_loop_t *)0x175711;
          uv_run(puVar5,UV_RUN_DEFAULT);
          puStack_2a0 = (uv_loop_t *)0x175716;
          puVar6 = uv_default_loop();
          puStack_2a0 = (uv_loop_t *)0x17571e;
          iVar2 = uv_loop_close(puVar6);
          piVar7 = (int *)0x1;
          if (iVar2 == 0) goto LAB_00175829;
          puStack_2a0 = (uv_loop_t *)0x175731;
          run_test_tty_cold_18();
          local_290 = extraout_EAX;
        }
        if ((int)local_28c < 0xb) goto LAB_0017586a;
        if ((int)local_290 < 0xb) goto LAB_0017586f;
        puStack_2a0 = (uv_loop_t *)0x175752;
        iVar2 = uv_tty_set_mode(&local_288,UV_TTY_MODE_RAW);
        if (iVar2 != 0) goto LAB_00175874;
        puStack_2a0 = (uv_loop_t *)0x175766;
        iVar2 = uv_tty_set_mode(&local_288,UV_TTY_MODE_NORMAL);
        if (iVar2 != 0) goto LAB_00175879;
        puStack_2a0 = (uv_loop_t *)0x175773;
        piVar7 = __errno_location();
        *piVar7 = 0;
        puStack_2a0 = (uv_loop_t *)0x175781;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_0017587e;
        puStack_2a0 = (uv_loop_t *)0x17578e;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_00175883;
        puStack_2a0 = (uv_loop_t *)0x17579b;
        iVar2 = uv_tty_reset_mode();
        if (iVar2 != 0) goto LAB_00175888;
        if (*piVar7 == 0) {
          piVar7 = (int *)0x0;
          puStack_2a0 = (uv_loop_t *)0x1757bc;
          uv_close((uv_handle_t *)&local_288,(uv_close_cb)0x0);
          puStack_2a0 = (uv_loop_t *)0x1757cb;
          uv_close((uv_handle_t *)&local_150,(uv_close_cb)0x0);
          puStack_2a0 = (uv_loop_t *)0x1757d5;
          uv_run(puVar5,UV_RUN_DEFAULT);
          puStack_2a0 = (uv_loop_t *)0x1757da;
          puVar5 = uv_default_loop();
          puStack_2a0 = (uv_loop_t *)0x1757ee;
          uv_walk(puVar5,close_walk_cb,(void *)0x0);
          puStack_2a0 = (uv_loop_t *)0x1757f8;
          uv_run(puVar5,UV_RUN_DEFAULT);
          puStack_2a0 = (uv_loop_t *)0x1757fd;
          puVar5 = uv_default_loop();
          puStack_2a0 = (uv_loop_t *)0x175805;
          iVar2 = uv_loop_close(puVar5);
          if (iVar2 == 0) goto LAB_00175829;
          puStack_2a0 = (uv_loop_t *)0x17580e;
          run_test_tty_cold_17();
          goto LAB_0017581e;
        }
      }
      else {
        puStack_2a0 = (uv_loop_t *)0x17583d;
        run_test_tty_cold_1();
LAB_0017583d:
        puStack_2a0 = (uv_loop_t *)0x175842;
        run_test_tty_cold_2();
LAB_00175842:
        puStack_2a0 = (uv_loop_t *)0x175847;
        run_test_tty_cold_3();
LAB_00175847:
        puStack_2a0 = (uv_loop_t *)0x17584c;
        run_test_tty_cold_4();
LAB_0017584c:
        puStack_2a0 = (uv_loop_t *)0x175851;
        run_test_tty_cold_20();
LAB_00175851:
        puStack_2a0 = (uv_loop_t *)0x175856;
        run_test_tty_cold_5();
LAB_00175856:
        puStack_2a0 = (uv_loop_t *)0x17585b;
        run_test_tty_cold_6();
LAB_0017585b:
        puStack_2a0 = (uv_loop_t *)0x175860;
        run_test_tty_cold_7();
LAB_00175860:
        puStack_2a0 = (uv_loop_t *)0x175865;
        run_test_tty_cold_19();
LAB_00175865:
        puStack_2a0 = (uv_loop_t *)0x17586a;
        run_test_tty_cold_8();
LAB_0017586a:
        puStack_2a0 = (uv_loop_t *)0x17586f;
        run_test_tty_cold_9();
LAB_0017586f:
        puStack_2a0 = (uv_loop_t *)0x175874;
        run_test_tty_cold_10();
LAB_00175874:
        puStack_2a0 = (uv_loop_t *)0x175879;
        run_test_tty_cold_11();
LAB_00175879:
        puStack_2a0 = (uv_loop_t *)0x17587e;
        run_test_tty_cold_12();
LAB_0017587e:
        puStack_2a0 = (uv_loop_t *)0x175883;
        run_test_tty_cold_13();
LAB_00175883:
        puStack_2a0 = (uv_loop_t *)0x175888;
        run_test_tty_cold_14();
LAB_00175888:
        puStack_2a0 = (uv_loop_t *)0x17588d;
        run_test_tty_cold_15();
      }
      puStack_2a0 = (uv_loop_t *)run_test_tty_file;
      run_test_tty_cold_16();
      pcStack_9a8 = (code *)0x1758a7;
      puStack_2a0 = puVar5;
      iVar2 = uv_loop_init((uv_loop_t *)(auStack_728 + 0x138));
      if (iVar2 == 0) {
        pcStack_9a8 = (code *)0x1758bf;
        uVar1 = open64("test/fixtures/empty_file",0);
        if (uVar1 != 0xffffffff) {
          puVar5 = (uv_loop_t *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x1758df;
          iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_00175bff;
          pcStack_9a8 = (code *)0x1758ef;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_001758f7;
          goto LAB_00175c04;
        }
LAB_001758f7:
        pcStack_9a8 = (code *)0x175907;
        uVar1 = open64("/dev/random",0);
        if (uVar1 != 0xffffffff) {
          puVar5 = (uv_loop_t *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x175927;
          iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_00175c09;
          pcStack_9a8 = (code *)0x175937;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_0017593f;
          goto LAB_00175c0e;
        }
LAB_0017593f:
        pcStack_9a8 = (code *)0x17594f;
        uVar1 = open64("/dev/zero",0);
        if (uVar1 != 0xffffffff) {
          puVar5 = (uv_loop_t *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x17596f;
          iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_998,uVar1,1);
          if (iVar2 != -0x16) goto LAB_00175c13;
          pcStack_9a8 = (code *)0x17597f;
          iVar2 = close(uVar1);
          if (iVar2 == 0) goto LAB_00175987;
          goto LAB_00175c18;
        }
LAB_00175987:
        pcStack_9a8 = (code *)0x17599a;
        uVar1 = open64("/dev/tty",2);
        if (uVar1 != 0xffffffff) {
          puVar5 = (uv_loop_t *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x1759be;
          iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_998,uVar1,1);
          if (iVar2 != 0) goto LAB_00175c1d;
          pcStack_9a8 = (code *)0x1759cd;
          iVar2 = close(uVar1);
          if (iVar2 != 0) goto LAB_00175c22;
          pcStack_9a8 = (code *)0x1759df;
          iVar2 = uv_is_readable((uv_stream_t *)auStack_998);
          if (iVar2 == 0) goto LAB_00175c27;
          pcStack_9a8 = (code *)0x1759f1;
          iVar2 = uv_is_writable((uv_stream_t *)auStack_998);
          if (iVar2 == 0) goto LAB_00175c2c;
          puVar5 = (uv_loop_t *)auStack_998;
          pcStack_9a8 = (code *)0x175a08;
          uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
          pcStack_9a8 = (code *)0x175a10;
          iVar2 = uv_is_readable((uv_stream_t *)puVar5);
          if (iVar2 != 0) goto LAB_00175c36;
          pcStack_9a8 = (code *)0x175a22;
          iVar2 = uv_is_writable((uv_stream_t *)auStack_998);
          if (iVar2 == 0) goto LAB_00175a2a;
          goto LAB_00175c40;
        }
LAB_00175a2a:
        pcStack_9a8 = (code *)0x175a3a;
        uVar1 = open64("/dev/tty",0);
        if (uVar1 != 0xffffffff) {
          puVar5 = (uv_loop_t *)(ulong)uVar1;
          pcStack_9a8 = (code *)0x175a61;
          iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_728,uVar1,1);
          if (iVar2 != 0) goto LAB_00175c31;
          pcStack_9a8 = (code *)0x175a70;
          iVar2 = close(uVar1);
          if (iVar2 != 0) goto LAB_00175c3b;
          pcStack_9a8 = (code *)0x175a85;
          iVar2 = uv_is_readable((uv_stream_t *)auStack_728);
          if (iVar2 == 0) goto LAB_00175c45;
          pcStack_9a8 = (code *)0x175a9a;
          iVar2 = uv_is_writable((uv_stream_t *)auStack_728);
          if (iVar2 != 0) goto LAB_00175c4a;
          puVar5 = (uv_loop_t *)auStack_728;
          pcStack_9a8 = (code *)0x175ab4;
          uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
          pcStack_9a8 = (code *)0x175abc;
          iVar2 = uv_is_readable((uv_stream_t *)puVar5);
          if (iVar2 != 0) goto LAB_00175c54;
          pcStack_9a8 = (code *)0x175ad1;
          iVar2 = uv_is_writable((uv_stream_t *)auStack_728);
          if (iVar2 == 0) goto LAB_00175ad9;
          goto LAB_00175c5e;
        }
LAB_00175ad9:
        pcStack_9a8 = (code *)0x175aec;
        uVar1 = open64("/dev/tty",1);
        if (uVar1 == 0xffffffff) {
LAB_00175b88:
          pcStack_9a8 = (code *)0x175b97;
          iVar2 = uv_run((uv_loop_t *)(auStack_728 + 0x138),UV_RUN_DEFAULT);
          if (iVar2 != 0) goto LAB_00175bf0;
          pcStack_9a8 = (code *)0x175ba8;
          iVar2 = uv_loop_close((uv_loop_t *)(auStack_728 + 0x138));
          if (iVar2 != 0) goto LAB_00175bf5;
          pcStack_9a8 = (code *)0x175bb1;
          puVar5 = uv_default_loop();
          pcStack_9a8 = (code *)0x175bc5;
          uv_walk(puVar5,close_walk_cb,(void *)0x0);
          pcStack_9a8 = (code *)0x175bcf;
          uv_run(puVar5,UV_RUN_DEFAULT);
          pcStack_9a8 = (code *)0x175bd4;
          puVar6 = uv_default_loop();
          pcStack_9a8 = (code *)0x175bdc;
          iVar2 = uv_loop_close(puVar6);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_00175bfa;
        }
        puVar5 = (uv_loop_t *)(ulong)uVar1;
        pcStack_9a8 = (code *)0x175b10;
        iVar2 = uv_tty_init((uv_loop_t *)(auStack_728 + 0x138),(uv_tty_t *)auStack_860,uVar1,0);
        if (iVar2 != 0) goto LAB_00175c4f;
        pcStack_9a8 = (code *)0x175b1f;
        iVar2 = close(uVar1);
        if (iVar2 != 0) goto LAB_00175c59;
        pcStack_9a8 = (code *)0x175b34;
        iVar2 = uv_is_readable((uv_stream_t *)auStack_860);
        if (iVar2 != 0) goto LAB_00175c63;
        pcStack_9a8 = (code *)0x175b49;
        iVar2 = uv_is_writable((uv_stream_t *)auStack_860);
        if (iVar2 == 0) goto LAB_00175c68;
        puVar5 = (uv_loop_t *)auStack_860;
        pcStack_9a8 = (code *)0x175b63;
        uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
        pcStack_9a8 = (code *)0x175b6b;
        iVar2 = uv_is_readable((uv_stream_t *)puVar5);
        if (iVar2 != 0) goto LAB_00175c6d;
        pcStack_9a8 = (code *)0x175b80;
        iVar2 = uv_is_writable((uv_stream_t *)auStack_860);
        if (iVar2 == 0) goto LAB_00175b88;
      }
      else {
        pcStack_9a8 = (code *)0x175bf0;
        run_test_tty_file_cold_1();
LAB_00175bf0:
        pcStack_9a8 = (code *)0x175bf5;
        run_test_tty_file_cold_26();
LAB_00175bf5:
        pcStack_9a8 = (code *)0x175bfa;
        run_test_tty_file_cold_27();
LAB_00175bfa:
        pcStack_9a8 = (code *)0x175bff;
        run_test_tty_file_cold_28();
LAB_00175bff:
        pcStack_9a8 = (code *)0x175c04;
        run_test_tty_file_cold_2();
LAB_00175c04:
        pcStack_9a8 = (code *)0x175c09;
        run_test_tty_file_cold_3();
LAB_00175c09:
        pcStack_9a8 = (code *)0x175c0e;
        run_test_tty_file_cold_4();
LAB_00175c0e:
        pcStack_9a8 = (code *)0x175c13;
        run_test_tty_file_cold_5();
LAB_00175c13:
        pcStack_9a8 = (code *)0x175c18;
        run_test_tty_file_cold_6();
LAB_00175c18:
        pcStack_9a8 = (code *)0x175c1d;
        run_test_tty_file_cold_7();
LAB_00175c1d:
        pcStack_9a8 = (code *)0x175c22;
        run_test_tty_file_cold_8();
LAB_00175c22:
        pcStack_9a8 = (code *)0x175c27;
        run_test_tty_file_cold_9();
LAB_00175c27:
        pcStack_9a8 = (code *)0x175c2c;
        run_test_tty_file_cold_13();
LAB_00175c2c:
        pcStack_9a8 = (code *)0x175c31;
        run_test_tty_file_cold_12();
LAB_00175c31:
        pcStack_9a8 = (code *)0x175c36;
        run_test_tty_file_cold_14();
LAB_00175c36:
        pcStack_9a8 = (code *)0x175c3b;
        run_test_tty_file_cold_10();
LAB_00175c3b:
        pcStack_9a8 = (code *)0x175c40;
        run_test_tty_file_cold_15();
LAB_00175c40:
        pcStack_9a8 = (code *)0x175c45;
        run_test_tty_file_cold_11();
LAB_00175c45:
        pcStack_9a8 = (code *)0x175c4a;
        run_test_tty_file_cold_19();
LAB_00175c4a:
        pcStack_9a8 = (code *)0x175c4f;
        run_test_tty_file_cold_16();
LAB_00175c4f:
        pcStack_9a8 = (code *)0x175c54;
        run_test_tty_file_cold_20();
LAB_00175c54:
        pcStack_9a8 = (code *)0x175c59;
        run_test_tty_file_cold_17();
LAB_00175c59:
        pcStack_9a8 = (code *)0x175c5e;
        run_test_tty_file_cold_21();
LAB_00175c5e:
        pcStack_9a8 = (code *)0x175c63;
        run_test_tty_file_cold_18();
LAB_00175c63:
        pcStack_9a8 = (code *)0x175c68;
        run_test_tty_file_cold_22();
LAB_00175c68:
        pcStack_9a8 = (code *)0x175c6d;
        run_test_tty_file_cold_25();
LAB_00175c6d:
        pcStack_9a8 = (code *)0x175c72;
        run_test_tty_file_cold_23();
      }
      pcStack_9a8 = run_test_tty_pty;
      run_test_tty_file_cold_24();
      puVar6 = (uv_loop_t *)(auStack_e38 + 0x138);
      puStack_9b0 = puVar5;
      pcStack_9a8 = (code *)piVar7;
      iVar2 = uv_loop_init(puVar6);
      if (iVar2 == 0) {
        iVar2 = openpty(&uStack_f7c,&uStack_f80,0,0,auStack_f78);
        if (iVar2 != 0) {
          run_test_tty_pty_cold_2();
          return 1;
        }
        puVar6 = (uv_loop_t *)(auStack_e38 + 0x138);
        iVar2 = uv_tty_init(puVar6,(uv_tty_t *)auStack_f70,uStack_f80,0);
        if (iVar2 != 0) goto LAB_00175e08;
        puVar6 = (uv_loop_t *)(auStack_e38 + 0x138);
        iVar2 = uv_tty_init(puVar6,(uv_tty_t *)auStack_e38,uStack_f7c,0);
        if (iVar2 != 0) goto LAB_00175e0d;
        puVar6 = (uv_loop_t *)auStack_f70;
        iVar2 = uv_is_readable((uv_stream_t *)puVar6);
        if (iVar2 == 0) goto LAB_00175e12;
        puVar6 = (uv_loop_t *)auStack_f70;
        iVar2 = uv_is_writable((uv_stream_t *)puVar6);
        if (iVar2 == 0) goto LAB_00175e17;
        puVar6 = (uv_loop_t *)auStack_e38;
        iVar2 = uv_is_readable((uv_stream_t *)puVar6);
        if (iVar2 == 0) goto LAB_00175e1c;
        puVar6 = (uv_loop_t *)auStack_e38;
        iVar2 = uv_is_writable((uv_stream_t *)puVar6);
        if (iVar2 == 0) goto LAB_00175e21;
        if ((auStack_f70[0x5a] & 0x10) != 0) goto LAB_00175e26;
        if ((auStack_e38[0x5a] & 0x10) == 0) goto LAB_00175e2b;
        puVar6 = (uv_loop_t *)(ulong)uStack_f80;
        iVar2 = close(uStack_f80);
        if (iVar2 != 0) goto LAB_00175e30;
        uv_close((uv_handle_t *)auStack_f70,(uv_close_cb)0x0);
        puVar6 = (uv_loop_t *)(ulong)uStack_f7c;
        iVar2 = close(uStack_f7c);
        if (iVar2 != 0) goto LAB_00175e35;
        uv_close((uv_handle_t *)auStack_e38,(uv_close_cb)0x0);
        puVar6 = (uv_loop_t *)(auStack_e38 + 0x138);
        iVar2 = uv_run(puVar6,UV_RUN_DEFAULT);
        if (iVar2 == 0) {
          puVar5 = uv_default_loop();
          uv_walk(puVar5,close_walk_cb,(void *)0x0);
          uv_run(puVar5,UV_RUN_DEFAULT);
          puVar6 = uv_default_loop();
          iVar2 = uv_loop_close(puVar6);
          if (iVar2 == 0) {
            return 0;
          }
          goto LAB_00175e3f;
        }
      }
      else {
        run_test_tty_pty_cold_1();
LAB_00175e08:
        run_test_tty_pty_cold_3();
LAB_00175e0d:
        run_test_tty_pty_cold_4();
LAB_00175e12:
        run_test_tty_pty_cold_14();
LAB_00175e17:
        run_test_tty_pty_cold_13();
LAB_00175e1c:
        run_test_tty_pty_cold_12();
LAB_00175e21:
        run_test_tty_pty_cold_11();
LAB_00175e26:
        run_test_tty_pty_cold_5();
LAB_00175e2b:
        run_test_tty_pty_cold_10();
LAB_00175e30:
        run_test_tty_pty_cold_6();
LAB_00175e35:
        run_test_tty_pty_cold_7();
      }
      run_test_tty_pty_cold_8();
LAB_00175e3f:
      run_test_tty_pty_cold_9();
      iVar2 = uv_is_closing((uv_handle_t *)puVar6);
      if (iVar2 != 0) {
        return iVar2;
      }
      uv_close((uv_handle_t *)puVar6,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
  }
LAB_0017581e:
  puStack_2a0 = (uv_loop_t *)0x175823;
  run_test_tty_cold_21();
  piVar7 = (int *)0x1;
LAB_00175829:
  return (int)piVar7;
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  int ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  HANDLE handle;
  handle = CreateFileA("conin$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyin_fd = _open_osfhandle((intptr_t) handle, 0);

  handle = CreateFileA("conout$",
                       GENERIC_READ | GENERIC_WRITE,
                       FILE_SHARE_READ | FILE_SHARE_WRITE,
                       NULL,
                       OPEN_EXISTING,
                       FILE_ATTRIBUTE_NORMAL,
                       NULL);
  ASSERT(handle != INVALID_HANDLE_VALUE);
  ttyout_fd = _open_osfhandle((intptr_t) handle, 0);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }
#endif

  ASSERT(ttyin_fd >= 0);
  ASSERT(ttyout_fd >= 0);

  ASSERT(UV_UNKNOWN_HANDLE == uv_guess_handle(-1));

  ASSERT(UV_TTY == uv_guess_handle(ttyin_fd));
  ASSERT(UV_TTY == uv_guess_handle(ttyout_fd));

  r = uv_tty_init(uv_default_loop(), &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT(r == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(uv_default_loop(), &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT(r == 0);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT(r == 0);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY();
    return TEST_SKIP;
  }

  /*
   * Is it a safe assumption that most people have terminals larger than
   * 10x10?
   */
  ASSERT(width > 10);
  ASSERT(height > 10);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT(r == 0);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT(r == 0);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == uv_tty_reset_mode());
  ASSERT(0 == errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}